

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdiarea.cpp
# Opt level: O2

void __thiscall QMdiAreaPrivate::appendChild(QMdiAreaPrivate *this,QMdiSubWindow *child)

{
  char *pcVar1;
  QWidget *parent;
  QMdiAreaTabBar *this_00;
  Representation RVar2;
  bool bVar3;
  QSize QVar4;
  QSize QVar5;
  QSize QVar6;
  Placer *placer;
  ulong uVar7;
  long in_FS_OFFSET;
  QObject local_68 [8];
  QObject local_60 [8];
  QArrayDataPointer<char16_t> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pcVar1 = *(char **)&(this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.
                      super_QWidgetPrivate.field_0x8;
  parent = (this->super_QAbstractScrollAreaPrivate).viewport;
  if (*(QWidget **)(*(long *)&(child->super_QWidget).field_0x8 + 0x10) != parent) {
    QWidget::setParent(&child->super_QWidget,parent,
                       (WindowFlags)
                       (((child->super_QWidget).data)->window_flags).
                       super_QFlagsStorageHelper<Qt::WindowType,_4>.
                       super_QFlagsStorage<Qt::WindowType>.i);
  }
  QPointer<QMdiSubWindow>::QPointer<void>((QPointer<QMdiSubWindow> *)&local_58,child);
  QList<QPointer<QMdiSubWindow>>::emplaceBack<QPointer<QMdiSubWindow>>
            ((QList<QPointer<QMdiSubWindow>> *)&this->childWindows,
             (QPointer<QMdiSubWindow> *)&local_58);
  QWeakPointer<QObject>::~QWeakPointer((QWeakPointer<QObject> *)&local_58);
  bVar3 = QWidget::testAttribute_helper(&child->super_QWidget,WA_Resized);
  if ((!bVar3) && ((*(byte *)(*(long *)(pcVar1 + 0x20) + 9) & 0x80) != 0)) {
    QVar4 = (QSize)(**(code **)(*(long *)&child->super_QWidget + 0x70))(child);
    QVar5 = QWidget::size((this->super_QAbstractScrollAreaPrivate).viewport);
    QVar6 = QVar5;
    if (QVar4.wd.m_i.m_i < QVar5.wd.m_i.m_i) {
      QVar6 = QVar4;
    }
    RVar2.m_i = QVar5.ht.m_i.m_i;
    if (QVar4.ht.m_i.m_i < QVar5.ht.m_i.m_i) {
      RVar2.m_i = QVar4.ht.m_i.m_i;
    }
    QVar4 = qSmartMinSize(&child->super_QWidget);
    if (QVar6.wd.m_i.m_i <= QVar4.wd.m_i.m_i) {
      QVar6 = QVar4;
    }
    uVar7 = (ulong)(uint)RVar2.m_i;
    if (RVar2.m_i <= QVar4.ht.m_i.m_i) {
      uVar7 = (ulong)QVar4 >> 0x20;
    }
    local_58.d = (Data *)((ulong)QVar6 & 0xffffffff | uVar7 << 0x20);
    QWidget::resize(&child->super_QWidget,(QSize *)&local_58);
  }
  placer = this->placer;
  if (placer == (Placer *)0x0) {
    placer = (Placer *)operator_new(8);
    placer->_vptr_Placer = (_func_int **)&PTR_place_007cfca0;
    this->placer = placer;
  }
  place(this,placer,child);
  QMdiSubWindow::setOption
            (child,AllowOutsideAreaHorizontally,
             (this->super_QAbstractScrollAreaPrivate).hbarpolicy != ScrollBarAlwaysOff);
  QMdiSubWindow::setOption
            (child,AllowOutsideAreaVertically,
             (this->super_QAbstractScrollAreaPrivate).vbarpolicy != ScrollBarAlwaysOff);
  internalRaise(this,child);
  QList<int>::prepend(&this->indicesToActivatedChildren,(int)(this->childWindows).d.size + -1);
  this_00 = this->tabBar;
  if (this_00 != (QMdiAreaTabBar *)0x0) {
    QWidget::windowIcon((QWidget *)&stack0xffffffffffffffc0);
    tabTextFor((QString *)&local_58,child);
    QTabBar::addTab(&this_00->super_QTabBar,(QIcon *)&stack0xffffffffffffffc0,(QString *)&local_58);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
    QIcon::~QIcon((QIcon *)&stack0xffffffffffffffc0);
    updateTabBarGeometry(this);
    if (((this->childWindows).d.size == 1) &&
       (((this->options).super_QFlagsStorageHelper<QMdiArea::AreaOption,_4>.
         super_QFlagsStorage<QMdiArea::AreaOption>.i & 1) == 0)) {
      this->showActiveWindowMaximized = true;
    }
  }
  if (((((child->super_QWidget).data)->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
       super_QFlagsStorage<Qt::WindowType>.i & 0x12) == 0) {
    QWidget::setWindowFlags(&child->super_QWidget,(WindowFlags)0x12);
  }
  QObject::installEventFilter((QObject *)child);
  QObject::connect(local_60,(char *)child,(QObject *)"2aboutToActivate()",pcVar1,0x65f71f);
  QMetaObject::Connection::~Connection((Connection *)local_60);
  QObject::connect(local_68,(char *)child,
                   (QObject *)"2windowStateChanged(Qt::WindowStates,Qt::WindowStates)",pcVar1,
                   0x65f771);
  QMetaObject::Connection::~Connection((Connection *)local_68);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMdiAreaPrivate::appendChild(QMdiSubWindow *child)
{
    Q_Q(QMdiArea);
    Q_ASSERT(child && childWindows.indexOf(child) == -1);

    if (child->parent() != viewport)
        child->setParent(viewport, child->windowFlags());
    childWindows.append(QPointer<QMdiSubWindow>(child));

    if (!child->testAttribute(Qt::WA_Resized) && q->isVisible()) {
        QSize newSize(child->sizeHint().boundedTo(viewport->size()));
        child->resize(newSize.expandedTo(qSmartMinSize(child)));
    }

    if (!placer)
        placer = new MinOverlapPlacer;
    place(placer, child);

    if (hbarpolicy != Qt::ScrollBarAlwaysOff)
        child->setOption(QMdiSubWindow::AllowOutsideAreaHorizontally, true);
    else
        child->setOption(QMdiSubWindow::AllowOutsideAreaHorizontally, false);

    if (vbarpolicy != Qt::ScrollBarAlwaysOff)
        child->setOption(QMdiSubWindow::AllowOutsideAreaVertically, true);
    else
        child->setOption(QMdiSubWindow::AllowOutsideAreaVertically, false);

    internalRaise(child);
    indicesToActivatedChildren.prepend(childWindows.size() - 1);
    Q_ASSERT(indicesToActivatedChildren.size() == childWindows.size());

#if QT_CONFIG(tabbar)
    if (tabBar) {
        tabBar->addTab(child->windowIcon(), tabTextFor(child));
        updateTabBarGeometry();
        if (childWindows.size() == 1 && !(options & QMdiArea::DontMaximizeSubWindowOnActivation))
            showActiveWindowMaximized = true;
    }
#endif

    if (!(child->windowFlags() & Qt::SubWindow))
        child->setWindowFlags(Qt::SubWindow);
    child->installEventFilter(q);

    QObject::connect(child, SIGNAL(aboutToActivate()), q, SLOT(_q_deactivateAllWindows()));
    QObject::connect(child, SIGNAL(windowStateChanged(Qt::WindowStates,Qt::WindowStates)),
                     q, SLOT(_q_processWindowStateChanged(Qt::WindowStates,Qt::WindowStates)));
}